

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O3

bool __thiscall ON_Polyline::IsClosed(ON_Polyline *this,double tolerance)

{
  int iVar1;
  ON_3dPoint *pOVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  iVar1 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
  if (3 < iVar1) {
    uVar5 = (ulong)(iVar1 - 1);
    pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
    if (tolerance <= 0.0) {
      bVar3 = ON_PointsAreCoincident(3,false,&pOVar2->x,&pOVar2[uVar5].x);
      if (!bVar3) {
        return false;
      }
      lVar4 = 0x18;
      do {
        pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
        bVar3 = ON_PointsAreCoincident(3,false,(double *)((long)&pOVar2->x + lVar4),&pOVar2->x);
        if ((!bVar3) &&
           (pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a,
           bVar3 = ON_PointsAreCoincident
                             (3,false,(double *)((long)&pOVar2->x + lVar4),&pOVar2[uVar5].x), !bVar3
           )) {
          return true;
        }
        lVar4 = lVar4 + 0x18;
      } while (uVar5 * 0x18 != lVar4);
    }
    else {
      dVar6 = ON_3dPoint::DistanceTo(pOVar2,pOVar2 + uVar5);
      if (dVar6 <= tolerance) {
        lVar4 = 0x18;
        do {
          pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
          dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)((long)&pOVar2->x + lVar4),pOVar2);
          if ((tolerance < dVar6) &&
             (pOVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a,
             dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)((long)&pOVar2->x + lVar4),pOVar2 + uVar5)
             , tolerance < dVar6)) {
            return true;
          }
          lVar4 = lVar4 + 0x18;
        } while (uVar5 * 0x18 != lVar4);
      }
    }
  }
  return false;
}

Assistant:

bool ON_Polyline::IsClosed( double tolerance ) const
{
  bool rc = false;
  const int count = m_count-1;
  int i;
  if ( count >= 3 )
  {
    if ( tolerance > 0.0 )
    {
      if ( m_a[0].DistanceTo(m_a[count]) <= tolerance ) {
        for ( i = 1; i < count; i++ ) {
          if (   m_a[i].DistanceTo(m_a[0]) > tolerance 
              && m_a[i].DistanceTo(m_a[count]) > tolerance ) 
          {
             rc = true;
             break;
          }
        }
      }
    }
    else
    {
      if ( ON_PointsAreCoincident(3,false,&m_a[0].x,&m_a[count].x) ) 
      {
        for ( i = 1; i < count; i++ ) {
          if (    !ON_PointsAreCoincident(3,false,&m_a[i].x,&m_a[0].x) 
               && !ON_PointsAreCoincident(3,false,&m_a[i].x,&m_a[count].x) 
             )
          {
            rc = true;
            break;
          }
        }
      }
    }
  }
  return rc;
}